

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConfigLiblistSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConfigLiblistSyntax,slang::parsing::Token&,slang::syntax::TokenList_const&>
          (BumpAllocator *this,Token *args,TokenList *args_1)

{
  Info *pIVar1;
  size_type sVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  SyntaxKind SVar7;
  undefined4 uVar8;
  ConfigLiblistSyntax *pCVar9;
  
  pCVar9 = (ConfigLiblistSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConfigLiblistSyntax *)this->endPtr < pCVar9 + 1) {
    pCVar9 = (ConfigLiblistSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pCVar9 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  (pCVar9->super_ConfigRuleClauseSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar9->super_ConfigRuleClauseSyntax).super_SyntaxNode.kind = ConfigLiblist;
  (pCVar9->liblist).kind = TVar3;
  (pCVar9->liblist).field_0x2 = uVar4;
  (pCVar9->liblist).numFlags = (NumericTokenFlags)NVar5.raw;
  (pCVar9->liblist).rawLen = uVar6;
  (pCVar9->liblist).info = pIVar1;
  SVar7 = (args_1->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar8 = *(undefined4 *)&(args_1->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pCVar9->libraries).super_SyntaxListBase.super_SyntaxNode.parent =
       (args_1->super_SyntaxListBase).super_SyntaxNode.parent;
  (pCVar9->libraries).super_SyntaxListBase.super_SyntaxNode.kind = SVar7;
  *(undefined4 *)&(pCVar9->libraries).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar8;
  (pCVar9->libraries).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (pCVar9->libraries).super_SyntaxListBase.childCount = (args_1->super_SyntaxListBase).childCount;
  sVar2 = (args_1->super_span<slang::parsing::Token,_18446744073709551615UL>).size_;
  (pCVar9->libraries).super_span<slang::parsing::Token,_18446744073709551615UL>.data_ =
       (args_1->super_span<slang::parsing::Token,_18446744073709551615UL>).data_;
  (pCVar9->libraries).super_span<slang::parsing::Token,_18446744073709551615UL>.size_ = sVar2;
  (pCVar9->libraries).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00507e50;
  (pCVar9->libraries).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pCVar9;
  return pCVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }